

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_manager.cc
# Opt level: O3

RC __thiscall PF_Manager::OpenFile(PF_Manager *this,char *fileName,PF_FileHandle *fileHandle)

{
  int iVar1;
  ssize_t sVar2;
  RC RVar3;
  
  RVar3 = 4;
  if (fileHandle->bFileOpen == 0) {
    iVar1 = open(fileName,2);
    fileHandle->unixfd = iVar1;
    if (iVar1 < 0) {
      RVar3 = -0xb;
    }
    else {
      sVar2 = read(iVar1,&fileHandle->hdr,8);
      if ((int)sVar2 == 8) {
        fileHandle->bHdrChanged = 0;
        fileHandle->pBufferMgr = this->pBufferMgr;
        RVar3 = 0;
        iVar1 = 1;
      }
      else {
        RVar3 = -0xb;
        if (-1 < (int)sVar2) {
          RVar3 = -5;
        }
        close(fileHandle->unixfd);
        iVar1 = 0;
      }
      fileHandle->bFileOpen = iVar1;
    }
  }
  return RVar3;
}

Assistant:

RC PF_Manager::OpenFile (const char *fileName, PF_FileHandle &fileHandle)
{
   int rc;                   // return code

   // Ensure file is not already open
   if (fileHandle.bFileOpen)
      return (PF_FILEOPEN);

   // Open the file
   if ((fileHandle.unixfd = open(fileName,
#ifdef PC
         O_BINARY |
#endif
         O_RDWR)) < 0)
      return (PF_UNIX);

   // Read the file header
   {
      int numBytes = read(fileHandle.unixfd, (char *)&fileHandle.hdr,
            sizeof(PF_FileHdr));
      if (numBytes != sizeof(PF_FileHdr)) {
         rc = (numBytes < 0) ? PF_UNIX : PF_HDRREAD;
         goto err;
      }
   }

   // Set file header to be not changed
   fileHandle.bHdrChanged = FALSE;

   // Set local variables in file handle object to refer to open file
   fileHandle.pBufferMgr = pBufferMgr;
   fileHandle.bFileOpen = TRUE;

   // Return ok
   return 0;

err:
   // Close file
   close(fileHandle.unixfd);
   fileHandle.bFileOpen = FALSE;

   // Return error
   return (rc);
}